

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O1

void __thiscall
CaDiCaL::heap<CaDiCaL::block_more_occs_size>::down(heap<CaDiCaL::block_more_occs_size> *this,uint e)

{
  pointer plVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint b;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  bVar3 = has_left(this,e);
  if (bVar3) {
    uVar2 = e >> 1;
    uVar10 = -uVar2;
    if ((e & 1) == 0) {
      uVar10 = uVar2;
    }
    do {
      uVar4 = left(this,e);
      bVar3 = has_right(this,e);
      b = uVar4;
      if (bVar3) {
        uVar5 = right(this,e);
        uVar6 = uVar4 >> 1;
        uVar7 = -uVar6;
        if ((uVar4 & 1) == 0) {
          uVar7 = uVar6;
        }
        uVar8 = uVar5 >> 1;
        uVar9 = -uVar8;
        if ((uVar5 & 1) == 0) {
          uVar9 = uVar8;
        }
        plVar1 = (((this->less).internal)->ntab).super__Vector_base<long,_std::allocator<long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        b = uVar5;
        if (((ulong)plVar1[-uVar7 >> 0x1f | uVar6 << 1] <=
             (ulong)plVar1[-uVar9 >> 0x1f | uVar8 << 1]) &&
           (b = uVar4,
           (ulong)plVar1[-uVar9 >> 0x1f | uVar8 << 1] <= (ulong)plVar1[-uVar7 >> 0x1f | uVar6 << 1])
           ) {
          b = uVar5;
          if ((ulong)plVar1[uVar6 << 1 | uVar7 >> 0x1f] <= (ulong)plVar1[uVar8 << 1 | uVar9 >> 0x1f]
             ) {
            if (uVar4 < uVar5) {
              uVar5 = uVar4;
            }
            b = uVar4;
            if ((ulong)plVar1[uVar8 << 1 | uVar9 >> 0x1f] <=
                (ulong)plVar1[uVar6 << 1 | uVar7 >> 0x1f]) {
              b = uVar5;
            }
          }
        }
      }
      uVar5 = b >> 1;
      uVar4 = -uVar5;
      if ((b & 1) == 0) {
        uVar4 = uVar5;
      }
      plVar1 = (((this->less).internal)->ntab).super__Vector_base<long,_std::allocator<long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)plVar1[-uVar10 >> 0x1f | uVar2 << 1] <= (ulong)plVar1[-uVar4 >> 0x1f | uVar5 << 1])
      {
        if ((ulong)plVar1[-uVar10 >> 0x1f | uVar2 << 1] < (ulong)plVar1[-uVar4 >> 0x1f | uVar5 << 1]
           ) {
          return;
        }
        if ((ulong)plVar1[uVar10 >> 0x1f | uVar2 << 1] <= (ulong)plVar1[uVar5 << 1 | uVar4 >> 0x1f])
        {
          if (e <= b) {
            return;
          }
          if ((ulong)plVar1[uVar10 >> 0x1f | uVar2 << 1] < (ulong)plVar1[uVar5 << 1 | uVar4 >> 0x1f]
             ) {
            return;
          }
        }
      }
      exchange(this,e,b);
      bVar3 = has_left(this,e);
    } while (bVar3);
  }
  return;
}

Assistant:

void down (unsigned e) {
    while (has_left (e)) {
      unsigned c = left (e);
      if (has_right (e)) {
        unsigned r = right (e);
        if (less (c, r))
          c = r;
      }
      if (!less (e, c))
        break;
      exchange (e, c);
    }
  }